

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

uint Abc_TtCanonicizeCA(Abc_TtHieMan_t *p,word *pTruth,int nVars,char *pCanonPerm,int fCA)

{
  uint uCanonPhase;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  Abc_SccCost_t c;
  Abc_TgMan_t tgManCopy;
  Abc_TgMan_t tgMan;
  Abc_TgMan_t local_1b8;
  Abc_TgMan_t local_f0;
  
  uVar8 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    uVar8 = 1;
  }
  if (nVars == 0) {
    memset(pTruth,0,(ulong)(uVar8 << 3));
    uVar1 = 0;
  }
  else {
    if (nVars < 6) {
      uVar1 = 1 << ((byte)nVars & 0x1f);
      uVar5 = ~(-1L << ((byte)uVar1 & 0x3f)) & *pTruth;
      uVar3 = (ulong)uVar1;
      uVar6 = uVar5;
      if ((uint)nVars < 6) {
        do {
          uVar6 = uVar6 | uVar5 << ((byte)uVar3 & 0x3f);
          uVar3 = uVar3 + uVar1;
        } while (uVar3 < 0x40);
      }
      if (*pTruth != uVar6) goto LAB_00501d46;
    }
    if (0 < (int)uVar8) {
      lVar4 = 0;
      do {
        *(undefined8 *)((long)gpVerCopy + lVar4) = *(undefined8 *)((long)pTruth + lVar4);
        lVar4 = lVar4 + 8;
      } while ((ulong)uVar8 << 3 != lVar4);
    }
    if (0x10 < nVars) {
      __assert_fail("nVars <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0xa5b,
                    "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)");
    }
    if (p == (Abc_TtHieMan_t *)0x0) {
      __assert_fail("p != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0xa5c,
                    "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)");
    }
    iVar2 = Abc_TtHieRetrieveOrInsert(p,-5,pTruth,pTruth);
    uVar1 = 0x20000000;
    if (iVar2 < 1) {
      Abc_TgInitMan(&local_f0,pTruth,nVars,2,p->vPhase);
      Abc_TgCreateGroups(&local_f0);
      iVar2 = Abc_TtHieRetrieveOrInsert(p,-4,pTruth,pTruth);
      if (iVar2 < 1) {
        Abc_TgPurgeSymmetry(&local_f0,1);
        Abc_TgExpendSymmetry(&local_f0,pCanonPerm);
        Abc_TgImplementPerm(&local_f0,pCanonPerm);
        uCanonPhase = local_f0.uPhase;
        iVar2 = local_f0.nVars;
        __n = (size_t)local_f0.nVars;
        uVar1 = 1 << ((byte)local_f0.nVars - 6 & 0x1f);
        if ((long)__n < 7) {
          uVar1 = 1;
        }
        if ((long)__n < 6) {
          uVar5 = 1L << ((byte)local_f0.nVars & 0x3f);
          uVar7 = ~(-1L << ((byte)uVar5 & 0x3f)) & *local_f0.pTruth;
          uVar3 = uVar5;
          uVar6 = uVar7;
          if ((uint)local_f0.nVars < 6) {
            do {
              uVar6 = uVar6 | uVar7 << ((byte)uVar3 & 0x3f);
              uVar3 = uVar3 + uVar5;
            } while (uVar3 < 0x40);
          }
          if (*local_f0.pTruth != uVar6) {
LAB_00501d46:
            __assert_fail("*pTruth == nTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                          ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
          }
        }
        if ((int)uVar1 < 1) {
          memcpy(&local_1b8,local_f0.pPermT,__n);
          Abc_TtImplementNpnConfig(&Abc_TtCannonVerify_pCopy2,iVar2,(char *)&local_1b8,uCanonPhase);
        }
        else {
          lVar4 = 0;
          do {
            *(undefined8 *)((long)&Abc_TtCannonVerify_pCopy2 + lVar4) =
                 *(undefined8 *)((long)local_f0.pTruth + lVar4);
            lVar4 = lVar4 + 8;
          } while ((ulong)uVar1 << 3 != lVar4);
          memcpy(&local_1b8,local_f0.pPermT,__n);
          Abc_TtImplementNpnConfig(&Abc_TtCannonVerify_pCopy2,iVar2,(char *)&local_1b8,uCanonPhase);
          lVar4 = 0;
          do {
            if (*(long *)((long)gpVerCopy + lVar4) !=
                *(long *)((long)&Abc_TtCannonVerify_pCopy2 + lVar4)) {
              __assert_fail("Abc_TgCannonVerify(&tgMan)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                            ,0xa66,
                            "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)"
                           );
            }
            lVar4 = lVar4 + 8;
          } while ((ulong)uVar1 << 3 != lVar4);
        }
        iVar2 = Abc_TtHieRetrieveOrInsert(p,-3,pTruth,pTruth);
        if (iVar2 < 1) {
          memcpy(&local_1b8,&local_f0,0xc0);
          uVar1 = 1 << ((char)local_f0.nVars - 6U & 0x1f);
          if (local_f0.nVars < 7) {
            uVar1 = 1;
          }
          if (0 < (int)uVar1) {
            lVar4 = 0;
            do {
              *(undefined8 *)((long)Abc_TtCanonicizeCA::pCopy + lVar4) =
                   *(undefined8 *)((long)local_f0.pTruth + lVar4);
              lVar4 = lVar4 + 8;
            } while ((ulong)uVar1 << 3 != lVar4);
          }
          local_1b8.pTruth = Abc_TtCanonicizeCA::pCopy;
          Abc_TgSimpleEnumeration(&local_f0);
          iVar2 = Abc_TtHieRetrieveOrInsert(p,-2,pTruth,pTruth);
          if (0 < iVar2) {
            return 0x20000000;
          }
          memcpy(&local_f0,&local_1b8,0xc0);
          uVar1 = 1 << ((char)local_1b8.nVars - 6U & 0x1f);
          if (local_1b8.nVars < 7) {
            uVar1 = 1;
          }
          if (0 < (int)uVar1) {
            uVar3 = 0;
            do {
              pTruth[uVar3] = local_1b8.pTruth[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar1 != uVar3);
          }
          local_f0.pTruth = pTruth;
          if (0 < (int)uVar8) {
            memset(pTruth,0xff,(ulong)uVar8 << 3);
          }
          iVar2 = Abc_TgCannonVerify(&local_1b8);
          if (iVar2 != 0) {
            c = Abc_TgRecordPhase(&local_1b8,0);
            uVar8 = 0;
            if ((fCA != 0) &&
               (dVar9 = Abc_SccEnumCost(&local_1b8,c), uVar8 = 0,
               (double)local_1b8.nVars * 0.997 + (double)local_1b8.nGVars * 1.043 + -15.9 < dVar9))
            {
              Abc_TgResetGroup(&local_1b8);
              Abc_TgRecordPhase(&local_1b8,1);
              uVar8 = 0x10000000;
            }
            Abc_TgFullEnumeration(&local_1b8,&local_f0);
            Abc_TtHieRetrieveOrInsert(p,-1,pTruth,pTruth);
            memcpy(pCanonPerm,local_f0.pPermT,(long)nVars);
            iVar2 = Abc_TgCannonVerify(&local_f0);
            if (iVar2 == 0) {
              puts("Canonical form verification failed!");
            }
            return uVar8 | local_f0.uPhase;
          }
          __assert_fail("Abc_TgCannonVerify(&tgManCopy)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                        ,0xa6f,
                        "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)"
                       );
        }
      }
      uVar1 = 0x20000000;
    }
  }
  return uVar1;
}

Assistant:

unsigned Abc_TtCanonicizeCA(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int fCA)
{
    int nWords = Abc_TtWordNum(nVars);
    unsigned fHard = 0, fHash = 1 << 29;
    static word pCopy[1024];
    Abc_TgMan_t tgMan, tgManCopy;
    Abc_SccCost_t sc;

    // handle constant
    if (nVars == 0) {
        Abc_TtClear(pTruth, nWords);
        return 0;
    }

    Abc_TtVerifySmallTruth(pTruth, nVars);
#ifdef CANON_VERIFY
    Abc_TtCopy(gpVerCopy, pTruth, nWords, 0);
#endif

    assert(nVars <= 16);
    assert(p != NULL);
    if (Abc_TtHieRetrieveOrInsert(p, -5, pTruth, pTruth) > 0) return fHash;
    Abc_TgInitMan(&tgMan, pTruth, nVars, 2, p->vPhase);

    Abc_TgCreateGroups(&tgMan);
    if (p && Abc_TtHieRetrieveOrInsert(p, -4, pTruth, pTruth) > 0) return fHash;
    Abc_TgPurgeSymmetry(&tgMan, 1);

    Abc_TgExpendSymmetry(&tgMan, pCanonPerm);
    Abc_TgImplementPerm(&tgMan, pCanonPerm);
    assert(Abc_TgCannonVerify(&tgMan));

    if (Abc_TtHieRetrieveOrInsert(p, -3, pTruth, pTruth) > 0) return fHash;
    Abc_TgManCopy(&tgManCopy, pCopy, &tgMan);
    Abc_TgSimpleEnumeration(&tgMan);
    if (Abc_TtHieRetrieveOrInsert(p, -2, pTruth, pTruth) > 0) return fHash;
    Abc_TgManCopy(&tgMan, pTruth, &tgManCopy);
    Abc_TtFill(pTruth, nWords);

    assert(Abc_TgCannonVerify(&tgManCopy));
    sc = Abc_TgRecordPhase(&tgManCopy, 0);
    if (fCA && Abc_SccEnumCost(&tgManCopy, sc) > Abc_SccPhaseCost(&tgManCopy))
    {
        Abc_TgResetGroup(&tgManCopy);
        sc = Abc_TgRecordPhase(&tgManCopy, 1);
        fHard = 1 << 28;
    }
    Abc_TgFullEnumeration(&tgManCopy, &tgMan);
    Abc_TtHieRetrieveOrInsert(p, -1, pTruth, pTruth);
    memcpy(pCanonPerm, tgMan.pPermT, sizeof(char) * nVars);

#ifdef CANON_VERIFY
    if (!Abc_TgCannonVerify(&tgMan))
        printf("Canonical form verification failed!\n");
#endif
    return tgMan.uPhase | fHard;
}